

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.c
# Opt level: O1

_Bool cs_reg_read(csh ud,cs_insn *insn,uint reg_id)

{
  cs_detail *pcVar1;
  ulong uVar2;
  undefined4 uVar3;
  ulong uVar4;
  ulong uVar5;
  _Bool _Var6;
  
  if (ud != 0) {
    uVar3 = 7;
    if (*(int *)(ud + 0x68) != 0) {
      if (insn->id == 0) {
        uVar3 = 0xb;
      }
      else {
        pcVar1 = insn->detail;
        if (pcVar1 != (cs_detail *)0x0) {
          uVar4 = (ulong)pcVar1->regs_read_count;
          _Var6 = uVar4 != 0;
          if ((_Var6) && (_Var6 = true, pcVar1->regs_read[0] != reg_id)) {
            uVar2 = 1;
            do {
              uVar5 = uVar2;
              if (uVar4 == uVar5) break;
              uVar2 = uVar5 + 1;
            } while (pcVar1->regs_read[uVar5] != reg_id);
            _Var6 = uVar5 < uVar4;
          }
          return _Var6;
        }
      }
    }
    *(undefined4 *)(ud + 0x58) = uVar3;
  }
  return false;
}

Assistant:

CAPSTONE_API cs_reg_read(csh ud, const cs_insn *insn, unsigned int reg_id)
{
	struct cs_struct *handle;
	if (!ud)
		return false;

	handle = (struct cs_struct *)(uintptr_t)ud;

	if (!handle->detail) {
		handle->errnum = CS_ERR_DETAIL;
		return false;
	}

	if(!insn->id) {
		handle->errnum = CS_ERR_SKIPDATA;
		return false;
	}

	if(!insn->detail) {
		handle->errnum = CS_ERR_DETAIL;
		return false;
	}

	return arr_exist(insn->detail->regs_read, insn->detail->regs_read_count, reg_id);
}